

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcoluj.c
# Opt level: O0

int ffgpvuj(fitsfile *fptr,long group,LONGLONG firstelem,LONGLONG nelem,unsigned_long nulval,
           unsigned_long *array,int *anynul,int *status)

{
  int iVar1;
  LONGLONG local_70;
  unsigned_long *local_68;
  unsigned_long nullvalue;
  int nullcheck;
  char cdummy;
  long row;
  unsigned_long *array_local;
  unsigned_long nulval_local;
  LONGLONG nelem_local;
  LONGLONG firstelem_local;
  long group_local;
  fitsfile *fptr_local;
  
  nullvalue._0_4_ = 1;
  row = (long)array;
  array_local = (unsigned_long *)nulval;
  nulval_local = nelem;
  nelem_local = firstelem;
  firstelem_local = group;
  group_local = (long)fptr;
  iVar1 = fits_is_compressed_image(fptr,status);
  if (iVar1 == 0) {
    if (firstelem_local < 1) {
      local_70 = 1;
    }
    else {
      local_70 = firstelem_local;
    }
    _nullcheck = local_70;
    ffgcluj((fitsfile *)group_local,2,local_70,nelem_local,nulval_local,1,1,
            (unsigned_long)array_local,(unsigned_long *)row,(char *)((long)&nullvalue + 7),anynul,
            status);
    fptr_local._4_4_ = *status;
  }
  else {
    local_68 = array_local;
    fits_read_compressed_pixels
              ((fitsfile *)group_local,0x28,nelem_local,nulval_local,(int)nullvalue,&local_68,
               (void *)row,(char *)0x0,anynul,status);
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgpvuj(fitsfile *fptr,   /* I - FITS file pointer                       */
            long  group,      /* I - group to read (1 = 1st group)           */
            LONGLONG  firstelem,  /* I - first vector element to read (1 = 1st)  */
            LONGLONG  nelem,      /* I - number of values to read                */
   unsigned long  nulval,     /* I - value for undefined pixels              */
   unsigned long  *array,     /* O - array of values that are returned       */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from the primary array. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
  Undefined elements will be set equal to NULVAL, unless NULVAL=0
  in which case no checking for undefined values will be performed.
  ANYNUL is returned with a value of .true. if any pixels are undefined.
*/
{
    long row;
    char cdummy;
    int nullcheck = 1;
    unsigned long nullvalue;

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */
        nullvalue = nulval;  /* set local variable */

        fits_read_compressed_pixels(fptr, TULONG, firstelem, nelem,
            nullcheck, &nullvalue, array, NULL, anynul, status);
        return(*status);
    }

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    row=maxvalue(1,group);

    ffgcluj(fptr, 2, row, firstelem, nelem, 1, 1, nulval,
               array, &cdummy, anynul, status);
    return(*status);
}